

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsReverse(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  long lVar3;
  int iVar4;
  
  Abc_NtkIncrementTravId(pNtk);
  p = Vec_PtrAlloc(100);
  for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar4);
    Abc_NodeSetTravIdCurrent(pAVar2);
    pAVar2 = Abc_ObjFanout0Ntk(pAVar2);
    for (lVar3 = 0; lVar3 < (pAVar2->vFanouts).nSize; lVar3 = lVar3 + 1) {
      Abc_NtkDfsReverse_rec
                ((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[lVar3]],p);
    }
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    for (iVar4 = 0; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar4);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        iVar1 = Abc_NodeIsConst(pAVar2);
        if (iVar1 != 0) {
          Vec_PtrPush(p,pAVar2);
        }
      }
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverse( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverse_rec( pFanout, vNodes );
    }
    // add constant nodes in the end
    if ( !Abc_NtkIsStrash(pNtk) ) {
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_NodeIsConst(pObj) )
                Vec_PtrPush( vNodes, pObj );
    }
    return vNodes;
}